

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_448ecb::ParameterPack::hasRHSComponentSlow(ParameterPack *this,OutputStream *S)

{
  Cache CVar1;
  Node *pNVar2;
  int iVar3;
  
  if (S->CurrentPackMax == 0xffffffff) {
    S->CurrentPackMax = (uint)(this->Data).NumElements;
    S->CurrentPackIndex = 0;
  }
  if ((ulong)S->CurrentPackIndex < (this->Data).NumElements) {
    pNVar2 = (this->Data).Elements[S->CurrentPackIndex];
    CVar1 = pNVar2->RHSComponentCache;
    if (CVar1 == Unknown) {
      iVar3 = (**pNVar2->_vptr_Node)();
      return SUB41(iVar3,0);
    }
    return CVar1 == Yes;
  }
  return false;
}

Assistant:

void initializePackExpansion(OutputStream &S) const {
    if (S.CurrentPackMax == std::numeric_limits<unsigned>::max()) {
      S.CurrentPackMax = static_cast<unsigned>(Data.size());
      S.CurrentPackIndex = 0;
    }
  }